

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  lu_int32 *plVar1;
  uint uVar2;
  global_State *pgVar3;
  byte bVar4;
  uint h;
  int iVar5;
  TString *pTVar6;
  TString *ts;
  GCObject *pGVar7;
  ulong local_40;
  GCObject **local_38;
  
  if (0x28 < l) {
    if (0x19 < l + 0x1b) {
      pTVar6 = createstrobj(L,str,l,0x14,L->l_G->seed,(GCObject **)0x0);
      return pTVar6;
    }
    luaM_toobig(L);
  }
  pgVar3 = L->l_G;
  h = luaS_hash(str,l,pgVar3->seed);
  local_38 = (pgVar3->strt).hash;
  uVar2 = (pgVar3->strt).size;
  local_40 = (ulong)(int)(uVar2 - 1 & h);
  pGVar7 = (GCObject *)(local_38 + local_40);
  do {
    pGVar7 = (pGVar7->gch).next;
    if (pGVar7 == (GCObject *)0x0) {
      if (((int)uVar2 < 0x3fffffff) && (uVar2 <= (pgVar3->strt).nuse)) {
        luaS_resize(L,uVar2 * 2);
        local_38 = (pgVar3->strt).hash;
        local_40 = (long)(int)h & (long)(pgVar3->strt).size - 1U;
      }
      pTVar6 = createstrobj(L,str,l,4,h,local_38 + local_40);
      plVar1 = &(pgVar3->strt).nuse;
      *plVar1 = *plVar1 + 1;
      return pTVar6;
    }
  } while (((h != (pGVar7->h).sizearray) || ((pGVar7->h).array != (TValue *)l)) ||
          (iVar5 = bcmp(str,&pGVar7->ts + 1,l), iVar5 != 0));
  bVar4 = (pGVar7->gch).marked ^ 3;
  if (((pgVar3->currentwhite ^ 3) & bVar4) == 0) {
    (pGVar7->gch).marked = bVar4;
  }
  return (TString *)pGVar7;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    if (l + 1 > (MAX_SIZET - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    return createstrobj(L, str, l, LUA_TLNGSTR, G(L)->seed, NULL);
  }
}